

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O0

vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> * __thiscall
deqp::ShaderLibrary::loadShaderFile
          (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *__return_storage_ptr__,
          ShaderLibrary *this,char *fileName)

{
  undefined8 uVar1;
  int iVar2;
  Archive *pAVar3;
  undefined4 extraout_var;
  reference pvVar4;
  undefined1 local_c0 [8];
  ShaderParser parser;
  exception *anon_var_0;
  undefined1 local_40 [4];
  int size;
  vector<char,_std::allocator<char>_> buf;
  Resource *resource;
  char *fileName_local;
  ShaderLibrary *this_local;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *nodes;
  
  pAVar3 = tcu::TestContext::getArchive(this->m_testCtx);
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ =
       (*pAVar3->_vptr_Archive[2])(pAVar3,fileName);
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = extraout_var;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_40);
  iVar2 = (**(code **)(*(long *)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ +
                      0x18))();
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)local_40,(long)(iVar2 + 1));
  uVar1 = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_40,0);
  (**(code **)(*(long *)uVar1 + 0x10))(uVar1,pvVar4,iVar2);
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_40,(long)iVar2);
  *pvVar4 = '\0';
  if (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ != 0) {
    (**(code **)(*(long *)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 8))()
    ;
  }
  sl::ShaderParser::ShaderParser((ShaderParser *)local_c0,this->m_testCtx,this->m_renderCtx);
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_40,0);
  sl::ShaderParser::parse(__return_storage_ptr__,(ShaderParser *)local_c0,pvVar4);
  sl::ShaderParser::~ShaderParser((ShaderParser *)local_c0);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  return __return_storage_ptr__;
}

Assistant:

vector<tcu::TestNode*> ShaderLibrary::loadShaderFile(const char* fileName)
{
	tcu::Resource*	resource = m_testCtx.getArchive().getResource(fileName);
	std::vector<char> buf;

	/*  printf("  loading '%s'\n", fileName);*/

	try
	{
		int size = resource->getSize();
		buf.resize(size + 1);
		resource->read((deUint8*)&buf[0], size);
		buf[size] = '\0';
	}
	catch (const std::exception&)
	{
		delete resource;
		throw;
	}

	delete resource;

	sl::ShaderParser	   parser(m_testCtx, m_renderCtx);
	vector<tcu::TestNode*> nodes = parser.parse(&buf[0]);

	return nodes;
}